

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-wast-parser.cc
# Opt level: O1

Errors * anon_unknown.dwarf_11604c::ParseInvalidModule(Errors *__return_storage_ptr__,string *text)

{
  pointer *__ptr;
  char *message;
  string_view filename;
  unique_ptr<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_> lexer;
  AssertionResult gtest_ar;
  unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_> module;
  Result result;
  Message local_68;
  WastLexer *local_60;
  internal local_58 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  __uniq_ptr_impl<wabt::Module,_std::default_delete<wabt::Module>_> local_48;
  Result local_3c;
  AssertHelper local_38;
  WastParseOptions local_2b;
  
  (__return_storage_ptr__->super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  filename._M_str = (char *)0x4;
  filename._M_len = (size_t)&local_60;
  wabt::WastLexer::CreateBufferLexer
            (filename,"test",(size_t)(text->_M_dataplus)._M_p,(Errors *)text->_M_string_length);
  local_48._M_t.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
  super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl =
       (tuple<wabt::Module_*,_std::default_delete<wabt::Module>_>)
       (_Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>)0x0;
  local_2b.features.exceptions_enabled_ = false;
  local_2b.features.mutable_globals_enabled_ = true;
  local_2b.features.sat_float_to_int_enabled_ = true;
  local_2b.features.sign_extension_enabled_ = true;
  local_2b.features.simd_enabled_ = true;
  local_2b.features.threads_enabled_ = false;
  local_2b.features.function_references_enabled_ = false;
  local_2b.features.multi_value_enabled_ = true;
  local_2b.features.tail_call_enabled_ = false;
  local_2b.features.bulk_memory_enabled_ = true;
  local_2b.features.reference_types_enabled_ = true;
  local_2b.features.annotations_enabled_ = false;
  local_2b.features.code_metadata_enabled_ = false;
  local_2b.features.gc_enabled_ = false;
  local_2b.features.memory64_enabled_ = false;
  local_2b.features.multi_memory_enabled_ = false;
  local_2b.features.extended_const_enabled_ = false;
  local_2b.features.relaxed_simd_enabled_ = false;
  local_2b.debug_parsing = false;
  local_3c = wabt::ParseWatModule
                       (local_60,(unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_> *)
                                 &local_48,__return_storage_ptr__,&local_2b);
  local_68.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 1;
  testing::internal::CmpHelperEQ<wabt::Result::Enum,wabt::Result>
            (local_58,"Result::Error","result",(Enum *)&local_68,&local_3c);
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message(&local_68);
    if (local_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_50->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/test-wast-parser.cc"
               ,0x2c,message);
    testing::internal::AssertHelper::operator=(&local_38,&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if ((long *)CONCAT44(local_68.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         local_68.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_68.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     local_68.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_4_) + 8))();
    }
  }
  if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_50,local_50);
  }
  std::unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_>::~unique_ptr
            ((unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_> *)&local_48);
  if (local_60 != (WastLexer *)0x0) {
    std::default_delete<wabt::WastLexer>::operator()
              ((default_delete<wabt::WastLexer> *)&local_60,local_60);
  }
  return __return_storage_ptr__;
}

Assistant:

Errors ParseInvalidModule(std::string text) {
  Errors errors;
  auto lexer =
      WastLexer::CreateBufferLexer("test", text.c_str(), text.size(), &errors);
  std::unique_ptr<Module> module;
  Features features;
  WastParseOptions options(features);
  Result result = ParseWatModule(lexer.get(), &module, &errors, &options);
  EXPECT_EQ(Result::Error, result);

  return errors;
}